

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  TokenKind TVar1;
  ExpressionSyntax *pEVar2;
  ElementSelectSyntax *syntax_00;
  ExpressionSyntax *pEVar3;
  Type *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  SourceLocation SVar9;
  StreamingConcatenationExpression *pSVar10;
  undefined4 extraout_var;
  ulong uVar11;
  StreamExpressionSyntax *pSVar12;
  Compilation *this_00;
  Type *pTVar13;
  ValueSymbol *pVVar14;
  Diagnostic *pDVar15;
  optional<int> value;
  size_t index;
  EvalContext *context_00;
  StreamingConcatenationExpression *unaff_R13;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  sVar16;
  SourceRange sourceRange;
  optional<slang::ConstantRange> oVar17;
  size_t sliceSize;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  EvalContext evalCtx;
  unsigned_long local_328;
  StreamingConcatenationExpressionSyntax *local_320;
  SourceRange local_318;
  undefined8 local_308;
  Expression *local_300;
  Type *local_2f8;
  _Storage<unsigned_int,_true> local_2ec;
  char *local_2e8;
  ulong local_2e0;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *local_2d8;
  SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> local_2d0 [2];
  undefined1 local_258 [16];
  _Storage<unsigned_int,_true> local_248;
  uint uStack_244;
  undefined4 uStack_240;
  undefined4 local_23c;
  undefined1 local_238 [184];
  LValue **local_180;
  size_type local_178;
  size_type local_170;
  LValue *local_168 [5];
  SmallVectorBase<slang::Diagnostic> local_140;
  SourceLocation local_48;
  SourceLocation SStack_40;
  Expression *this;
  
  TVar1 = (syntax->operatorToken).kind;
  local_328 = 0;
  local_2f8 = assignmentTarget;
  if (((context->flags).m_bits & 0x200) == 0) {
    SVar9 = parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag(context,(DiagCode)0x290007,SVar9);
    pTVar13 = comp->errorType;
    local_258._0_8_ = (Scope *)0x0;
    local_258._8_4_ = 0;
    local_258._12_4_ = 0;
    local_2d0[0]._0_16_ =
         (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pSVar10 = BumpAllocator::
              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,pTVar13,&local_328,
                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                          *)local_258,(SourceRange *)local_2d0);
    pSVar10 = (StreamingConcatenationExpression *)
              Expression::badExpr(comp,&pSVar10->super_Expression);
    return &pSVar10->super_Expression;
  }
  local_320 = syntax;
  if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
    if (TVar1 == LeftShift) {
      local_328 = 1;
    }
    goto LAB_003b0499;
  }
  iVar7 = Expression::bind((int)syntax->sliceSize,(sockaddr *)context,4);
  this = (Expression *)CONCAT44(extraout_var,iVar7);
  bVar5 = Expression::bad(this);
  if (bVar5) {
    pTVar13 = comp->errorType;
    local_258._0_8_ = (Compilation *)0x0;
    local_258._8_4_ = 0;
    local_258._12_4_ = 0;
    local_2d0[0]._0_16_ =
         (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pSVar10 = BumpAllocator::
              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,pTVar13,&local_328,
                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                          *)local_258,(SourceRange *)local_2d0);
    unaff_R13 = (StreamingConcatenationExpression *)
                Expression::badExpr(comp,&pSVar10->super_Expression);
LAB_003b046e:
    bVar5 = false;
  }
  else if (this->kind == DataType) {
    pTVar13 = (this->type).ptr;
    if (pTVar13 == (Type *)0x0) {
LAB_003b0cc2:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar5 = Type::isFixedSize(pTVar13);
    if (bVar5) {
      pTVar13 = (this->type).ptr;
      if (pTVar13 == (Type *)0x0) goto LAB_003b0cc2;
      local_328 = Type::bitstreamWidth(pTVar13);
      goto LAB_003b0b91;
    }
    pDVar15 = ASTContext::addDiag(context,(DiagCode)0x2c0007,this->sourceRange);
    pTVar13 = (this->type).ptr;
    if (pTVar13 == (Type *)0x0) goto LAB_003b0cc2;
    SVar9 = (pTVar13->super_Symbol).location;
    if (((ulong)SVar9 & 0xfffffff) != 0) {
      Diagnostic::addNote(pDVar15,(DiagCode)0x40001,SVar9);
    }
    pTVar13 = comp->errorType;
    local_258._0_8_ = (Compilation *)0x0;
    local_258._8_4_ = 0;
    local_258._12_4_ = 0;
    local_2d0[0]._0_16_ =
         (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pSVar10 = BumpAllocator::
              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,pTVar13,&local_328,
                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                          *)local_258,(SourceRange *)local_2d0);
    unaff_R13 = (StreamingConcatenationExpression *)
                Expression::badExpr(comp,&pSVar10->super_Expression);
    bVar5 = false;
  }
  else {
    value = ASTContext::evalInteger(context,this);
    bVar5 = ASTContext::requireGtZero(context,value,this->sourceRange);
    if (!bVar5) {
      pTVar13 = comp->errorType;
      local_258._0_8_ = (Compilation *)0x0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_2d0[0]._0_16_ =
           (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
      pSVar10 = BumpAllocator::
                emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                          (&comp->super_BumpAllocator,pTVar13,&local_328,
                           (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                            *)local_258,(SourceRange *)local_2d0);
      unaff_R13 = (StreamingConcatenationExpression *)
                  Expression::badExpr(comp,&pSVar10->super_Expression);
      goto LAB_003b046e;
    }
    local_328 = (unsigned_long)
                value.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_payload;
    unaff_R13 = (StreamingConcatenationExpression *)context;
LAB_003b0b91:
    bVar5 = true;
    if (TVar1 != LeftShift) {
      local_328 = 0;
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_320->sliceSize->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0x980007,sourceRange);
      bVar5 = true;
    }
  }
  if (!bVar5) {
    return &unaff_R13->super_Expression;
  }
LAB_003b0499:
  local_2d0[0].len = 0;
  local_2d0[0].data_ = (pointer)((long)local_2d0 + 0x18);
  local_2d0[0].cap = 4;
  uVar11 = (local_320->expressions).elements.size_ + 1;
  bVar5 = uVar11 < 2;
  if (!bVar5) {
    local_2d8 = &local_320->expressions;
    local_2e0 = uVar11 >> 1;
    local_2e8 = 
    "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
    index = 0;
    do {
      pSVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::
                operator[](local_2d8,index);
      if (local_2f8 == (Type *)0x0) {
LAB_003b05bf:
        pEVar2 = (pSVar12->expression).ptr;
        if (pEVar2 == (ExpressionSyntax *)0x0) {
LAB_003b0c65:
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
        this_00 = (Compilation *)
                  Expression::selfDetermined
                            (comp,pEVar2,context,(bitmask<slang::ast::ASTFlags>)0x200);
      }
      else {
        pEVar2 = (pSVar12->expression).ptr;
        if (pEVar2 == (ExpressionSyntax *)0x0) goto LAB_003b0c65;
        if ((pEVar2->super_SyntaxNode).kind != StreamingConcatenationExpression) goto LAB_003b05bf;
        this_00 = (Compilation *)
                  Expression::create(comp,pEVar2,context,(bitmask<slang::ast::ASTFlags>)0x200,
                                     local_2f8);
      }
      bVar6 = Expression::bad((Expression *)this_00);
      if (bVar6) {
        pTVar13 = comp->errorType;
        local_258._0_8_ = (Compilation *)0x0;
        local_258._8_4_ = 0;
        local_258._12_4_ = 0;
        local_318 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
        pSVar10 = BumpAllocator::
                  emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                            (&comp->super_BumpAllocator,pTVar13,&local_328,
                             (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                              *)local_258,&local_318);
        unaff_R13 = (StreamingConcatenationExpression *)
                    Expression::badExpr(comp,&pSVar10->super_Expression);
LAB_003b07d7:
        bVar6 = false;
      }
      else {
        if (pSVar12->withRange == (StreamExpressionWithRangeSyntax *)0x0) {
          local_308 = 0;
          local_300 = (Expression *)0x0;
        }
        else {
          pTVar13 = ((not_null<const_slang::ast::Type_*> *)&(this_00->super_BumpAllocator).endPtr)->
                    ptr;
          if (pTVar13 == (Type *)0x0) {
LAB_003b0d0c:
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,local_2e8);
          }
          bVar6 = Type::isUnpackedArray(pTVar13);
          if (bVar6) {
            if (pTVar13->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar13);
            }
            if ((pTVar13->canonical->super_Symbol).kind == AssociativeArrayType) goto LAB_003b074d;
            pTVar13 = Type::getArrayElementType(pTVar13);
            bVar6 = Type::isFixedSize(pTVar13);
            if (!bVar6) goto LAB_003b074d;
            syntax_00 = (pSVar12->withRange->range).ptr;
            if (syntax_00 == (ElementSelectSyntax *)0x0) {
              local_2e8 = 
              "T slang::not_null<slang::syntax::ElementSelectSyntax *>::get() const [T = slang::syntax::ElementSelectSyntax *]"
              ;
              goto LAB_003b0d0c;
            }
            ASTContext::resetFlags
                      ((ASTContext *)local_258,context,(bitmask<slang::ast::ASTFlags>)0x800000000);
            local_300 = Expression::bindSelector
                                  (comp,(Expression *)this_00,syntax_00,(ASTContext *)local_258);
            bVar6 = Expression::bad(local_300);
            if (bVar6) {
              pTVar13 = comp->errorType;
              local_258._0_8_ = (Compilation *)0x0;
              local_258._8_4_ = 0;
              local_258._12_4_ = 0;
              local_318 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
              pSVar10 = BumpAllocator::
                        emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                  (&comp->super_BumpAllocator,pTVar13,&local_328,
                                   (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                    *)local_258,&local_318);
              unaff_R13 = (StreamingConcatenationExpression *)
                          Expression::badExpr(comp,&pSVar10->super_Expression);
              goto LAB_003b07c9;
            }
            local_258._8_4_ = local_258._8_4_ & 0xffffff00;
            local_258._12_4_ = 0;
            local_248._M_value = 0;
            uStack_244 = 0;
            uStack_240 = 0;
            local_23c = 0;
            local_238._0_8_ = local_238 + 0x18;
            local_238._8_8_ = (RandomizeDetails *)0x0;
            local_238._16_8_ = (AssertionInstanceDetails *)0x2;
            local_180 = local_168;
            local_178 = 0;
            local_170 = 5;
            local_140.data_ = (pointer)local_140.firstElement;
            local_140.len = 0;
            local_140.cap = 2;
            local_48 = (SourceLocation)0x0;
            SStack_40 = (SourceLocation)0x0;
            context_00 = (EvalContext *)local_258;
            local_258._0_8_ = comp;
            oVar17 = Expression::evalSelector(local_300,context_00);
            if (((undefined1  [12])
                 oVar17.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
                (undefined1  [12])0x0) {
              local_308 = 0;
            }
            else {
              iVar8 = oVar17.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_ -
                      oVar17.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              local_2ec._M_value = iVar7 + 1;
              local_308 = 0x100000000;
            }
            SmallVectorBase<slang::Diagnostic>::cleanup(&local_140,(EVP_PKEY_CTX *)context_00);
            if (local_180 != local_168) {
              free(local_180);
            }
            SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                      ((SmallVectorBase<slang::ast::EvalContext::Frame> *)local_238,
                       (EVP_PKEY_CTX *)context_00);
            bVar6 = true;
          }
          else {
LAB_003b074d:
            ASTContext::addDiag(context,(DiagCode)0x300007,
                                *(SourceRange *)&(this_00->options).maxConstexprBacktrace);
            pTVar13 = comp->errorType;
            local_258._0_8_ = (Compilation *)0x0;
            local_258._8_4_ = 0;
            local_258._12_4_ = 0;
            local_318 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
            pSVar10 = BumpAllocator::
                      emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                (&comp->super_BumpAllocator,pTVar13,&local_328,
                                 (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                  *)local_258,&local_318);
            unaff_R13 = (StreamingConcatenationExpression *)
                        Expression::badExpr(comp,&pSVar10->super_Expression);
            local_300 = (Expression *)0x0;
LAB_003b07c9:
            local_308 = 0;
            bVar6 = false;
          }
          if (!bVar6) goto LAB_003b07d7;
        }
        pEVar3 = (pSVar12->expression).ptr;
        if (pEVar3 == (ExpressionSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
        if ((pEVar3->super_SyntaxNode).kind != StreamingConcatenationExpression) {
          pTVar13 = ((not_null<const_slang::ast::Type_*> *)&(this_00->super_BumpAllocator).endPtr)->
                    ptr;
          if (pTVar13 == (Type *)0x0) {
LAB_003b0ca3:
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                      );
          }
          if (pTVar13->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar13);
          }
          if (((pTVar13->canonical->super_Symbol).kind == UnpackedUnionType) &&
             (bVar6 = Type::isTaggedUnion(pTVar13), !bVar6)) {
            if (pTVar13->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar13);
            }
            pTVar4 = pTVar13->canonical;
            if ((pTVar4->super_Symbol).kind != UnpackedUnionType) {
              assert::assertFailed
                        ("T::isKind(kind)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                         ,0xc4,
                         "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::UnpackedUnionType]"
                        );
            }
            if (*(int *)&pTVar4[1].super_Symbol.nextInScope != 0) {
              Scope::elaborate((Scope *)(pTVar4 + 1));
            }
            SVar9 = pTVar4[1].super_Symbol.location;
            if (SVar9 != (SourceLocation)0x0) {
              pVVar14 = Symbol::as<slang::ast::ValueSymbol>((Symbol *)SVar9);
              pTVar13 = DeclaredType::getType(&pVVar14->declaredType);
            }
          }
          bVar6 = Type::isBitstreamType(pTVar13,local_2f8 == (Type *)0x0);
          if (!bVar6) {
            pDVar15 = ASTContext::addDiag(context,(DiagCode)0x2a0007,
                                          *(SourceRange *)&(this_00->options).maxConstexprBacktrace)
            ;
            pTVar13 = ((not_null<const_slang::ast::Type_*> *)&(this_00->super_BumpAllocator).endPtr)
                      ->ptr;
            if (pTVar13 == (Type *)0x0) goto LAB_003b0ca3;
            ast::operator<<(pDVar15,pTVar13);
            pTVar13 = comp->errorType;
            local_258._0_8_ = (Compilation *)0x0;
            local_258._8_4_ = 0;
            local_258._12_4_ = 0;
            local_318 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
            pSVar10 = BumpAllocator::
                      emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                (&comp->super_BumpAllocator,pTVar13,&local_328,
                                 (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                  *)local_258,&local_318);
            unaff_R13 = (StreamingConcatenationExpression *)
                        Expression::badExpr(comp,&pSVar10->super_Expression);
          }
          if (!bVar6) {
            bVar6 = false;
            goto LAB_003b097c;
          }
        }
        local_258._8_4_ = SUB84(local_300,0);
        local_258._12_4_ = (undefined4)((ulong)local_300 >> 0x20);
        uStack_244 = (uint)((ulong)local_308 >> 0x20) & 1;
        local_248 = local_2ec;
        local_258._0_8_ = this_00;
        SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
        emplace_back<slang::ast::StreamingConcatenationExpression::StreamExpression>
                  (local_2d0,(StreamExpression *)local_258);
        bVar6 = true;
      }
LAB_003b097c:
      if (!bVar6) break;
      index = index + 1;
      bVar5 = local_2e0 == index;
    } while (!bVar5);
  }
  if (bVar5) {
    pTVar13 = comp->voidType;
    sVar16 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::ccopy
                       (local_2d0,&comp->super_BumpAllocator);
    local_258._0_8_ = sVar16.data_;
    local_258._8_4_ = (undefined4)sVar16.size_;
    local_258._12_4_ = sVar16.size_._4_4_;
    local_318 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
    unaff_R13 = BumpAllocator::
                emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                          (&comp->super_BumpAllocator,pTVar13,&local_328,
                           (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                            *)local_258,&local_318);
  }
  if (local_2d0[0].data_ != (pointer)((long)local_2d0 + 0x18U)) {
    free(local_2d0[0].data_);
  }
  return &unaff_R13->super_Expression;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context, const Type* assignmentTarget) {

    // The sole purpose of assignmentTarget here is to know whether this is a
    // "destination" stream (i.e. an unpack operation) or whether it is a source / pack.
    // Streaming concatenation is self-determined and its size/type should not be affected
    // by assignmentTarget.
    const bool isDestination = !assignmentTarget;

    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    size_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, span<const StreamExpression>(),
                                 syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->bitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<size_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        Expression* arg;
        if (assignmentTarget &&
            argSyntax->expression->kind == SyntaxKind::StreamingConcatenationExpression) {
            arg = &create(comp, *argSyntax->expression, context, ASTFlags::StreamingAllowed,
                          assignmentTarget);
        }
        else {
            arg = &selfDetermined(comp, *argSyntax->expression, context,
                                  ASTFlags::StreamingAllowed);
        }

        if (arg->bad())
            return badResult();

        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue). Interpreted as fixed-sized unpacked arrays,
            // dynamic arrays, or queues of fixed-size elements.
            auto& arrayType = *arg->type;
            if (!arrayType.isUnpackedArray() || arrayType.isAssociativeArray() ||
                !arrayType.getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg->sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, *arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            EvalContext evalCtx(comp);
            auto range = withExpr->evalSelector(evalCtx);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            const Type* type = arg->type;
            if (type->isUnpackedUnion() && !type->isTaggedUnion()) {
                auto& uu = type->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    type = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!type->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg->sourceRange) << *arg->type;
                return badResult();
            }
        }

        buffer.push_back({arg, withExpr, constantWithWidth});
    }

    // Streaming concatenation has no explicit type. Use void to prevent problems when
    // its type is passed to context-determined expressions.
    return *comp.emplace<StreamingConcatenationExpression>(comp.getVoidType(), sliceSize,
                                                           buffer.ccopy(comp),
                                                           syntax.sourceRange());
}